

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O0

string * directories::MADPGetResultsDir(string *method,MultiAgentDecisionProcessInterface *problem)

{
  long *in_RDX;
  string *in_RDI;
  string *in_stack_00000040;
  string *in_stack_00000048;
  string local_38 [56];
  
  (**(code **)(*in_RDX + 0x20))();
  MADPGetResultsDir(in_stack_00000048,in_stack_00000040);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

string
directories::MADPGetResultsDir(const string & method,
                               const MultiAgentDecisionProcessInterface
                               *problem)
{
    return(MADPGetResultsDir(method,problem->GetUnixName()));
}